

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_read_file(char *file,kvtree *hash)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  
  uVar3 = 1;
  if ((hash != (kvtree *)0x0 && file != (char *)0x0) &&
     (iVar1 = kvtree_file_is_readable(file), iVar1 == 0)) {
    iVar1 = kvtree_open(file,0);
    if (iVar1 < 0) {
      kvtree_err("Opening hash file for read %s @ %s:%d",file,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                 ,0x5c7);
    }
    else {
      sVar2 = kvtree_read_fd(file,iVar1,hash);
      iVar1 = kvtree_close(file,iVar1);
      uVar3 = 1;
      if (iVar1 == 0) {
        uVar3 = (uint)((ulong)sVar2 >> 0x3f);
      }
    }
  }
  return uVar3;
}

Assistant:

int kvtree_read_file(const char* file, kvtree* hash)
{
  /* check that we have a hash and a file name */
  if (file == NULL || hash == NULL) {
    return KVTREE_FAILURE;
  }

  /* can't read file, return error (special case so as not to print
   * error message below) */
  if (kvtree_file_is_readable(file) != KVTREE_SUCCESS) {
    return KVTREE_FAILURE;
  }

  /* open the hash file */
  int fd = kvtree_open(file, O_RDONLY);
  if (fd < 0) {
    kvtree_err("Opening hash file for read %s @ %s:%d",
      file, __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* got the file open, be sure to close it even if we hit an error in
   * the read */
  int rc = KVTREE_SUCCESS;

  /* read the hash */
  ssize_t nread = kvtree_read_fd(file, fd, hash);
  if (nread < 0) {
    rc = KVTREE_FAILURE;
  }

  /* close the hash file */
  if (kvtree_close(file, fd) != KVTREE_SUCCESS) {
    rc = KVTREE_FAILURE;
  }

  return rc;
}